

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptRegExpConstructor::DeleteProperty
          (JavascriptRegExpConstructor *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  ScriptContext *scriptContext;
  ScriptContext *this_00;
  PropertyRecord *this_01;
  char16 *varName;
  PropertyOperationFlags flags_local;
  PropertyId propertyId_local;
  JavascriptRegExpConstructor *this_local;
  
  if ((propertyId - 0x1d0U < 0x10) || (propertyId - 0x1e3U < 4)) {
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_01 = ScriptContext::GetPropertyName(this_00,propertyId);
    varName = PropertyRecord::GetBuffer(this_01);
    JavascriptError::ThrowCantDeleteIfStrictMode(flags,scriptContext,varName);
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ =
         JavascriptFunction::DeleteProperty((JavascriptFunction *)this,propertyId,flags);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptRegExpConstructor::DeleteProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        switch (propertyId)
        {
            // all globals are 'fNoDelete' in V5.8
        case PropertyIds::input:
        case PropertyIds::$_:
        case PropertyIds::lastMatch:
        case PropertyIds::$Ampersand:
        case PropertyIds::lastParen:
        case PropertyIds::$Plus:
        case PropertyIds::leftContext:
        case PropertyIds::$BackTick:
        case PropertyIds::rightContext:
        case PropertyIds::$Tick:
        case PropertyIds::$1:
        case PropertyIds::$2:
        case PropertyIds::$3:
        case PropertyIds::$4:
        case PropertyIds::$5:
        case PropertyIds::$6:
        case PropertyIds::$7:
        case PropertyIds::$8:
        case PropertyIds::$9:
        case PropertyIds::index:
            JavascriptError::ThrowCantDeleteIfStrictMode(flags, GetScriptContext(), GetScriptContext()->GetPropertyName(propertyId)->GetBuffer());
            return false;

        default:
            return JavascriptFunction::DeleteProperty(propertyId, flags);
        }
    }